

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O0

Transform * __thiscall
sf::Transform::rotate(Transform *this,float angle,float centerX,float centerY)

{
  Transform *pTVar1;
  float in_XMM0_Da;
  float fVar2;
  double dVar3;
  float in_XMM1_Da;
  float in_XMM2_Da;
  Transform rotation;
  float sin;
  float cos;
  float rad;
  Transform local_60;
  float local_20;
  float local_1c;
  
  fVar2 = (in_XMM0_Da * 3.1415927) / 180.0;
  dVar3 = std::cos((double)(ulong)(uint)fVar2);
  local_1c = SUB84(dVar3,0);
  dVar3 = std::sin((double)(ulong)(uint)fVar2);
  local_20 = SUB84(dVar3,0);
  Transform(&local_60,local_1c,-local_20,in_XMM1_Da * (1.0 - local_1c) + in_XMM2_Da * local_20,
            local_20,local_1c,in_XMM2_Da * (1.0 - local_1c) + -(in_XMM1_Da * local_20),0.0,0.0,1.0);
  pTVar1 = combine((Transform *)CONCAT44(in_XMM0_Da,in_XMM1_Da),
                   (Transform *)CONCAT44(in_XMM2_Da,fVar2));
  return pTVar1;
}

Assistant:

Transform& Transform::rotate(float angle, float centerX, float centerY)
{
    float rad = angle * 3.141592654f / 180.f;
    float cos = std::cos(rad);
    float sin = std::sin(rad);

    Transform rotation(cos, -sin, centerX * (1 - cos) + centerY * sin,
                       sin,  cos, centerY * (1 - cos) - centerX * sin,
                       0,    0,   1);

    return combine(rotation);
}